

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderLimitsTransformFeedbackBase::initTest
          (GeometryShaderLimitsTransformFeedbackBase *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  pointer_____offset_0x10___ *ppuVar6;
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x325);
    ppuVar6 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar2);
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])
              (this,&this->m_fragment_shader_parts,&this->m_n_fragment_shader_parts,
               &this->m_geometry_shader_parts,&this->m_n_geometry_shader_parts,
               &this->m_vertex_shader_parts,&this->m_n_vertex_shader_parts);
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,&this->m_captured_varyings_names,&this->m_n_captured_varyings);
    GVar3 = (**(code **)(lVar5 + 0x3c8))();
    this->m_program_object_id = GVar3;
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fragment_shader_id = GVar3;
    GVar3 = (**(code **)(lVar5 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
    this->m_geometry_shader_id = GVar3;
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vertex_shader_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Failed to create program or shader object(s)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x339);
    (**(code **)(lVar5 + 0x14c8))
              (this->m_program_object_id,this->m_n_captured_varyings,this->m_captured_varyings_names
               ,0x8c8c);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Failed to set transform feedback varyings",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x33f);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_program_object_id,
                       this->m_fragment_shader_id,this->m_n_fragment_shader_parts,
                       this->m_fragment_shader_parts,this->m_geometry_shader_id,
                       this->m_n_geometry_shader_parts,this->m_geometry_shader_parts,
                       this->m_vertex_shader_id,this->m_n_vertex_shader_parts,
                       this->m_vertex_shader_parts,(bool *)0x0);
    if (bVar1) {
      (**(code **)(lVar5 + 0x708))(1,&this->m_vertex_array_object_id);
      (**(code **)(lVar5 + 0xd8))(this->m_vertex_array_object_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not create vertex array object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0x34e);
      (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])
                (this,&this->m_buffer_size);
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_buffer_object_id);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_buffer_object_id);
      (**(code **)(lVar5 + 0x150))(0x8892,this->m_buffer_size,0,0x88e6);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not create buffer object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0x358);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not create program from valid vertex/geometry/fragment shader",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x347);
    ppuVar6 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar6,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderLimitsTransformFeedbackBase::initTest()
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve ES entrypoints */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get shaders code from child class */
	getShaderParts(m_fragment_shader_parts, m_n_fragment_shader_parts, m_geometry_shader_parts,
				   m_n_geometry_shader_parts, m_vertex_shader_parts, m_n_vertex_shader_parts);

	/* Get captured varyings from inheriting class */
	getCapturedVaryings(m_captured_varyings_names, m_n_captured_varyings);

	/* Create program and shaders */
	m_program_object_id = gl.createProgram();

	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create program or shader object(s)");

	/* Set up transform feedback */
	gl.transformFeedbackVaryings(m_program_object_id, m_n_captured_varyings, m_captured_varyings_names,
								 GL_INTERLEAVED_ATTRIBS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set transform feedback varyings");

	/* Build program */
	if (false == buildProgram(m_program_object_id, m_fragment_shader_id, m_n_fragment_shader_parts,
							  m_fragment_shader_parts, m_geometry_shader_id, m_n_geometry_shader_parts,
							  m_geometry_shader_parts, m_vertex_shader_id, m_n_vertex_shader_parts,
							  m_vertex_shader_parts))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}

	/* Generate and bind VAO */
	gl.genVertexArrays(1, &m_vertex_array_object_id);
	gl.bindVertexArray(m_vertex_array_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");

	/* Get size of buffer used by transform feedback from child class */
	getTransformFeedbackBufferSize(m_buffer_size);

	/* Generate, bind and allocate buffer */
	gl.genBuffers(1, &m_buffer_object_id);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer_object_id);
	gl.bufferData(GL_ARRAY_BUFFER, m_buffer_size, 0 /* no start data */, GL_STATIC_COPY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create buffer object");
}